

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::ClientImpl::process_socket
          (ClientImpl *this,Socket *socket,function<bool_(httplib::Stream_&)> *callback)

{
  _Manager_type p_Var1;
  bool bVar2;
  long lVar3;
  Stream local_90;
  socket_t local_88;
  time_t local_80;
  time_t local_78;
  time_t local_70;
  time_t local_68;
  void *local_60;
  void *pvStack_58;
  long local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  local_88 = socket->sock;
  local_80 = this->read_timeout_sec_;
  local_78 = this->read_timeout_usec_;
  local_70 = this->write_timeout_sec_;
  local_68 = this->write_timeout_usec_;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = (_Manager_type)0x0;
  local_20 = callback->_M_invoker;
  p_Var1 = (callback->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_38._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(callback->super__Function_base)._M_functor;
    local_38._8_8_ = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
    (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    callback->_M_invoker = (_Invoker_type)0x0;
    local_28 = p_Var1;
  }
  local_90._vptr_Stream = (_func_int **)&PTR__SocketStream_0023a898;
  local_60 = (void *)0x0;
  pvStack_58 = (void *)0x0;
  local_50 = 0;
  local_60 = operator_new(0x1000);
  lVar3 = (long)local_60 + 0x1000;
  pvStack_58 = local_60;
  local_50 = lVar3;
  memset(local_60,0,0x1000);
  local_48 = 0;
  uStack_40 = 0;
  pvStack_58 = (void *)lVar3;
  if (local_28 != (_Manager_type)0x0) {
    bVar2 = (*local_20)(&local_38,&local_90);
    local_90._vptr_Stream = (_func_int **)&PTR__SocketStream_0023a898;
    if (local_60 != (void *)0x0) {
      operator_delete(local_60,local_50 - (long)local_60);
    }
    if (local_28 != (_Manager_type)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    return bVar2;
  }
  std::__throw_bad_function_call();
}

Assistant:

inline bool
        ClientImpl::process_socket(const Socket& socket,
            std::function<bool(Stream& strm)> callback) {
        return detail::process_client_socket(
            socket.sock, read_timeout_sec_, read_timeout_usec_, write_timeout_sec_,
            write_timeout_usec_, std::move(callback));
    }